

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::RepeatLoopFixedInst::Exec
          (RepeatLoopFixedInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  code *pcVar1;
  bool bVar2;
  BeginLoopFixedInst *pBVar3;
  LoopInfo *pLVar4;
  uint8 *puVar5;
  Cont *pCVar6;
  undefined4 *puVar7;
  RewindLoopFixedCont *this_00;
  RewindLoopFixedCont *rewind;
  Cont *top;
  LoopInfo *loopInfo;
  BeginLoopFixedInst *begin;
  bool firstIteration_local;
  CharCount *inputOffset_local;
  CharCount *matchStart_local;
  CharCount inputLength_local;
  Char *input_local;
  Matcher *matcher_local;
  RepeatLoopFixedInst *this_local;
  
  pBVar3 = Matcher::LabelToInstPointer<UnifiedRegex::BeginLoopFixedInst>
                     (matcher,BeginLoopFixed,(this->super_RepeatLoopMixin).beginLabel);
  pLVar4 = Matcher::LoopIdToLoopInfo
                     (matcher,(pBVar3->super_BeginLoopMixin).super_BeginLoopBasicsMixin.loopId);
  pLVar4->number = pLVar4->number + 1;
  if (pLVar4->number < (pBVar3->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.lower) {
    puVar5 = Matcher::LabelToInstPointer(matcher,(this->super_RepeatLoopMixin).beginLabel + 0x17);
    *instPointer = puVar5;
  }
  else if (((pBVar3->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.upper == 0xffffffff)
          || (pLVar4->number <
              (pBVar3->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.upper)) {
    if (pLVar4->number == (pBVar3->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.lower) {
      this_00 = (RewindLoopFixedCont *)
                ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
                Push<UnifiedRegex::RewindLoopFixedCont>
                          (&contStack->
                            super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
      RewindLoopFixedCont::RewindLoopFixedCont
                (this_00,(this->super_RepeatLoopMixin).beginLabel,true);
      Matcher::PushStats(matcher,contStack,input);
    }
    puVar5 = Matcher::LabelToInstPointer(matcher,(this->super_RepeatLoopMixin).beginLabel + 0x17);
    *instPointer = puVar5;
  }
  else {
    if ((pBVar3->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.lower <
        (pBVar3->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.upper) {
      pCVar6 = ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::Top
                         (&contStack->
                           super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
      if (pCVar6 == (Cont *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                           ,0xd20,"(top != 0)","top != 0");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      if (pCVar6->tag != RewindLoopFixed) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                           ,0xd21,"(top->tag == Cont::ContTag::RewindLoopFixed)",
                           "top->tag == Cont::ContTag::RewindLoopFixed");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      *(undefined1 *)&pCVar6[1]._vptr_Cont = 0;
    }
    puVar5 = Matcher::LabelToInstPointer(matcher,(pBVar3->super_BeginLoopMixin).exitLabel);
    *instPointer = puVar5;
  }
  return false;
}

Assistant:

inline bool RepeatLoopFixedInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        BeginLoopFixedInst* begin = matcher.L2I(BeginLoopFixed, beginLabel);
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(begin->loopId);

        loopInfo->number++;

        if (loopInfo->number < begin->repeats.lower)
        {
            // Must match another iteration of body. Failure of body signals failure of the entire loop.
            instPointer = matcher.LabelToInstPointer(beginLabel + sizeof(BeginLoopFixedInst));
        }
        else if (begin->repeats.upper != CharCountFlag && loopInfo->number >= (CharCount)begin->repeats.upper)
        {
            // Matched maximum number of iterations. Continue with follow.
            if (begin->repeats.lower < begin->repeats.upper)
            {
                // Failure of follow will try one fewer iterations (subject to repeats.lower).
                // Since loop body is non-deterministic and does not define groups the rewind continuation must be on top of the stack.
                Cont *top = contStack.Top();
                Assert(top != 0);
                Assert(top->tag == Cont::ContTag::RewindLoopFixed);
                RewindLoopFixedCont* rewind = (RewindLoopFixedCont*)top;
                rewind->tryingBody = false;
            }
            // else: we never pushed a rewind continuation
            instPointer = matcher.LabelToInstPointer(begin->exitLabel);
        }
        else
        {
            // CHOICEPOINT: Try one more iteration of body. Failure of body will rewind input to here and
            // try follow.
            if (loopInfo->number == begin->repeats.lower)
            {
                // i.e. begin->repeats.lower > 0, so continuation won't have been pushed in BeginLoopFixed
                PUSH(contStack, RewindLoopFixedCont, beginLabel, true);
#if ENABLE_REGEX_CONFIG_OPTIONS
                matcher.PushStats(contStack, input);
#endif
            }
            instPointer = matcher.LabelToInstPointer(beginLabel + sizeof(BeginLoopFixedInst));
        }
        return false;
    }